

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void dequantize_row_q4_1(void *x,float *y,int k)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  int iVar5;
  undefined1 auVar6 [16];
  float v1;
  float v0;
  int8_t vi1;
  int8_t vi0;
  uint8_t vi;
  int l;
  uint8_t *pp;
  float d;
  float m;
  int i;
  uint8_t *pb;
  float *pd;
  float *pm;
  int nb;
  int k_local;
  float *y_local;
  void *x_local;
  
  iVar5 = k / 0x20;
  for (i = 0; i < iVar5; i = i + 1) {
    uVar1 = *(uint *)((long)x + (long)i * 4);
    uVar2 = *(uint *)((long)x + (long)i * 4 + (long)iVar5 * 4);
    for (l = 0; l < 0x20; l = l + 2) {
      bVar3 = *(byte *)((long)x +
                       (long)(l / 2) + (long)((i << 5) / 2) + (long)iVar5 * 4 + (long)iVar5 * 4);
      auVar4 = vfmadd213ss_fma(ZEXT416(uVar2),ZEXT416((uint)(float)(int)(char)(bVar3 & 0xf)),
                               ZEXT416(uVar1));
      auVar6._0_4_ = (float)(int)(char)((int)(uint)bVar3 >> 4);
      auVar6._4_12_ = auVar4._4_12_;
      auVar6 = vfmadd213ss_fma(ZEXT416(uVar2),auVar6,ZEXT416(uVar1));
      y[i * 0x20 + l] = auVar4._0_4_;
      y[i * 0x20 + l + 1] = auVar6._0_4_;
    }
  }
  return;
}

Assistant:

void dequantize_row_q4_1(const void * restrict x, float * restrict y, int k) {
    assert(k % QK == 0);

    const int nb = k / QK;

    const float   * restrict pm = (const float *)   (x);
    const float   * restrict pd = (const float *)   (pm + nb);
    const uint8_t * restrict pb = (const uint8_t *) (pd + nb);

    for (int i = 0; i < nb; i++) {
        const float m = pm[i];
        const float d = pd[i];

        const uint8_t * restrict pp = pb + i*QK/2;

        for (int l = 0; l < QK; l += 2) {
            const uint8_t vi = pp[l/2];

            const int8_t vi0 = vi & 0xf;
            const int8_t vi1 = vi >> 4;

            const float v0 = vi0*d + m;
            const float v1 = vi1*d + m;

            y[i*QK + l + 0] = v0;
            y[i*QK + l + 1] = v1;

            assert(!isnan(y[i*QK + l + 0]));
            assert(!isnan(y[i*QK + l + 1]));
        }
    }
}